

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

void __thiscall WasmCGen::Local_set(WasmCGen *this)

{
  string local_30;
  WasmCGen *local_10;
  WasmCGen *this_local;
  
  local_10 = this;
  printf("/*%s*/\n","Local_set");
  Local_tee(this);
  w3SourceGen::pop_abi_cxx11_(&local_30,&this->super_w3SourceGen);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

CGEN (Local_set)
{
    printf ("/*%s*/\n", __func__);
    Local_tee ();
    pop ();
}